

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O3

void __thiscall pg::PPQSolver::run(PPQSolver *this)

{
  bitset *this_00;
  uint64_t *puVar1;
  uint64_t *puVar2;
  char cVar3;
  int *piVar4;
  uint *puVar5;
  ostream *poVar6;
  Error *this_01;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  Game *pGVar12;
  ulong uVar13;
  _label_vertex local_48;
  bitset *local_38;
  
  this->iterations = 0;
  pGVar12 = (this->super_Solver).game;
  uVar9 = pGVar12->n_vertices;
  uVar7 = uVar9 * 4;
  uVar13 = -(ulong)(uVar9 >> 0x3e != 0) | uVar7;
  piVar4 = (int *)operator_new__(uVar13);
  this->str = piVar4;
  if (uVar9 == 0) {
    piVar4 = (int *)operator_new__(uVar7);
    this->r = piVar4;
    piVar4 = (int *)operator_new__(uVar7);
    this->u = piVar4;
  }
  else {
    memset(piVar4,0xff,uVar7);
    piVar4 = (int *)operator_new__(uVar13);
    this->r = piVar4;
    if (0 < (long)uVar9) {
      uVar8 = 0;
      puVar2 = ((this->super_Solver).disabled)->_bits;
      do {
        iVar10 = -1;
        if ((puVar2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
          iVar10 = pGVar12->_priority[uVar8];
        }
        piVar4[uVar8] = iVar10;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    piVar4 = (int *)operator_new__(uVar13);
    this->u = piVar4;
    memset(piVar4,0xff,uVar7);
  }
  (this->Q).pointer = 0;
  puVar5 = (this->Q).queue;
  if (puVar5 != (uint *)0x0) {
    operator_delete__(puVar5);
    pGVar12 = (this->super_Solver).game;
  }
  puVar5 = (uint *)operator_new__(uVar7 & 0x3fffffffc);
  (this->Q).queue = puVar5;
  bitset::resize(&this->L,pGVar12->n_vertices);
  bitset::resize(&this->R,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->U,((this->super_Solver).game)->n_vertices);
  local_38 = &this->W0;
  bitset::resize(local_38,((this->super_Solver).game)->n_vertices);
  this_00 = &this->W1;
  bitset::resize(this_00,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->G,((this->super_Solver).game)->n_vertices);
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  puVar2 = (this->G)._bits;
  if ((this->G)._bitssize == 0) {
    uVar7 = 0;
  }
  else {
    uVar9 = 0;
    do {
      puVar2[uVar9] = ~puVar2[uVar9];
      uVar9 = uVar9 + 1;
      uVar7 = (this->G)._bitssize;
    } while (uVar9 < uVar7);
  }
  uVar9 = (this->G)._size & 0x3f;
  if (uVar9 != 0) {
    puVar2[uVar7 - 1] = puVar2[uVar7 - 1] & ~(-1L << uVar9);
    uVar7 = (this->G)._bitssize;
  }
  uVar9 = 0;
  do {
    if (uVar7 == uVar9) goto LAB_00158649;
    puVar1 = puVar2 + uVar9;
    uVar9 = uVar9 + 1;
  } while (*puVar1 == 0);
  lVar11 = uVar7 * -0x40;
  iVar10 = (int)((this->super_Solver).game)->n_vertices;
  do {
    lVar11 = lVar11 + 0x40;
    if (puVar2[uVar7 - 1] != 0) {
      uVar7 = LZCOUNT(puVar2[uVar7 - 1]) - lVar11 ^ 0x3f;
      goto LAB_00158636;
    }
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
  uVar7 = 0xffffffffffffffff;
LAB_00158636:
  solve(this,iVar10 + -1,this->r[uVar7],0x7fffffff,iVar10,iVar10);
LAB_00158649:
  lVar11 = ((this->super_Solver).game)->n_vertices;
  if (1 < (this->super_Solver).trace) {
    if (lVar11 < 1) goto LAB_001588b0;
    uVar7 = 0;
    do {
      uVar9 = uVar7 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar9] >> (uVar7 & 0x3f) & 1) == 0) {
        poVar6 = (this->super_Solver).logger;
        uVar13 = 1L << (uVar7 & 0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vertex ",7);
        local_48.g = (this->super_Solver).game;
        local_48.v = (int)uVar7;
        poVar6 = operator<<(poVar6,&local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," is solved by",0xd);
        if ((((this->W0)._bits[uVar9] & uVar13) != 0) &&
           (std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_Solver).logger," even",5),
           ((((this->super_Solver).game)->_owner)._bits[uVar9] & uVar13) == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," (",2);
          poVar6 = (this->super_Solver).logger;
          if (this->str[uVar7] == -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-1",2);
          }
          else {
            local_48.g = (this->super_Solver).game;
            local_48.v = this->str[uVar7];
            operator<<(poVar6,&local_48);
          }
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,")",1);
        }
        if (((this_00->_bits[uVar9] & uVar13) != 0) &&
           (std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," odd",4)
           , ((((this->super_Solver).game)->_owner)._bits[uVar9] & uVar13) != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," (",2);
          poVar6 = (this->super_Solver).logger;
          if (this->str[uVar7] == -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-1",2);
          }
          else {
            local_48.g = (this->super_Solver).game;
            local_48.v = this->str[uVar7];
            operator<<(poVar6,&local_48);
          }
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,")",1);
        }
        poVar6 = (this->super_Solver).logger;
        cVar3 = (char)poVar6;
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        lVar11 = ((this->super_Solver).game)->n_vertices;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < lVar11);
  }
  if (0 < lVar11) {
    uVar7 = 0;
    do {
      uVar9 = uVar7 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar9] >> (uVar7 & 0x3f) & 1) == 0) {
        uVar13 = 1L << (uVar7 & 0x3f);
        if ((local_38->_bits[uVar9] & uVar13) != 0) {
          Oink::solve((this->super_Solver).oink,(int)uVar7,0,this->str[uVar7]);
        }
        if ((this_00->_bits[uVar9] & uVar13) != 0) {
          Oink::solve((this->super_Solver).oink,(int)uVar7,1,this->str[uVar7]);
        }
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < ((this->super_Solver).game)->n_vertices);
  }
LAB_001588b0:
  poVar6 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"solved with ",0xc);
  poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," iterations.",0xc);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar7 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar7) {
    uVar9 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        this_01 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_01,"search was incomplete!",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ppq.cpp"
                     ,0x252);
        __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  return;
}

Assistant:

void
PPQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];
    std::fill(str, str+nodecount(), -1);

    r = new int[nodecount()];
    for (int v=0; v<nodecount(); v++) {
        if (!disabled[v]) r[v] = priority(v);
        else r[v] = -1;
    }

    u = new int[nodecount()];
    std::fill(u, u+nodecount(), -1);

    Q.resize(nodecount());
    L.resize(nodecount());
    R.resize(nodecount());
    U.resize(nodecount());

    W0.resize(nodecount());
    W1.resize(nodecount());
    
    G.resize(nodecount()); 
    G = disabled;
    G.flip();

    if (G.any()) {
        solve(nodecount()-1, r[G.find_last()], INT_MAX, nodecount(), nodecount()); // caller has INT_MAX priority...
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    delete[] str;
}